

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O0

void __thiscall
GrcManager::CreateAutoPseudoGlyphDefn(GrcManager *this,utf16 wAssigned,int nUnicode,gid16 wGlyphID)

{
  void *pvVar1;
  GdlGlyphDefn *this_00;
  GdlRenderer *this_01;
  utf16 in_SI;
  GdlGlyphClassDefn *in_RDI;
  GrpLineAndFile lnf;
  GdlGlyphClassDefn *pglfc;
  GdlGlyphDefn *pglf;
  GdlGlyphDefn *pglfOutput;
  undefined8 in_stack_ffffffffffffff68;
  int nInput;
  GdlGlyphClassDefn *pglfc_00;
  GdlGlyphDefn *in_stack_ffffffffffffff70;
  undefined1 local_68 [48];
  GdlGlyphDefn *local_38;
  void *local_20;
  utf16 local_a;
  
  local_a = in_SI;
  pvVar1 = operator_new(0xb0);
  GdlGlyphDefn::GdlGlyphDefn
            (in_stack_ffffffffffffff70,(GlyphType)((ulong)in_stack_ffffffffffffff68 >> 0x20),
             (int)in_stack_ffffffffffffff68);
  nInput = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_20 = pvVar1;
  this_00 = (GdlGlyphDefn *)operator_new(0xb0);
  GdlGlyphDefn::GdlGlyphDefn
            ((GdlGlyphDefn *)in_RDI,(GlyphType)((ulong)this_00 >> 0x20),in_stack_ffffffffffffff70,
             nInput);
  local_38 = this_00;
  GdlGlyphDefn::SetAssignedPseudo(this_00,local_a);
  this_01 = (GdlRenderer *)operator_new(0x110);
  GdlGlyphClassDefn::GdlGlyphClassDefn((GdlGlyphClassDefn *)this_01);
  pglfc_00 = (GdlGlyphClassDefn *)local_68;
  local_68._40_8_ = this_01;
  GrpLineAndFile::GrpLineAndFile((GrpLineAndFile *)0x139249);
  GdlGlyphClassDefn::AddMember(in_RDI,&this_00->super_GdlGlyphClassMember,(GrpLineAndFile *)this_01)
  ;
  GdlRenderer::AddGlyphClass(this_01,pglfc_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01,
             (value_type_conflict *)pglfc_00);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_RDI,
             (value_type_conflict2 *)this_00);
  GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x1392be);
  return;
}

Assistant:

void GrcManager::CreateAutoPseudoGlyphDefn(utf16 wAssigned, int nUnicode, gid16 wGlyphID)
{
	GdlGlyphDefn * pglfOutput = new GdlGlyphDefn(kglftGlyphID, wGlyphID);
	GdlGlyphDefn * pglf = new GdlGlyphDefn(kglftPseudo, pglfOutput, nUnicode);
	pglf->SetAssignedPseudo(wAssigned);

	GdlGlyphClassDefn * pglfc = new GdlGlyphClassDefn();
	GrpLineAndFile lnf;	// bogus
	pglfc->AddMember(pglf, lnf);
	m_prndr->AddGlyphClass(pglfc);
	
	m_vnUnicodeForPseudo.push_back(nUnicode);
	m_vwPseudoForUnicode.push_back(wAssigned);
}